

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params)

{
  char *pcVar1;
  Branch *pBVar2;
  String local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  pcVar1 = (this->text).content.ptr;
  __return_storage_ptr__->size_ = (size_t)pcVar1;
  heapString(&local_38,(size_t)pcVar1);
  (__return_storage_ptr__->text).content.ptr = local_38.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_38.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_38.content.disposer;
  pBVar2 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                               ::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  pcVar1 = (this->text).content.ptr;
  (__return_storage_ptr__->branches).ptr = pBVar2;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  if (pcVar1 != (char *)0x0) {
    if (local_38.content.size_ == 0) {
      local_38.content.ptr = (char *)0x0;
    }
    memcpy(local_38.content.ptr,(void *)this->size_,(size_t)pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}